

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covariance_matrix_generator.cc
# Opt level: O2

void webrtc::CovarianceMatrixGenerator::AngledCovarianceMatrix
               (float sound_speed,float angle,size_t frequency_bin,size_t fft_size,
               size_t num_freq_bins,int sample_rate,
               vector<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               *geometry,ComplexMatrix<float> *mat)

{
  float fVar1;
  float fVar2;
  int line;
  string *psVar3;
  size_t sVar4;
  float fVar5;
  float local_2a0;
  uint local_29c;
  ComplexMatrix<float> interf_cov_vector;
  ComplexMatrix<float> interf_cov_vector_transposed;
  FatalMessage local_1a8;
  
  local_1a8._0_8_ =
       ((long)(geometry->
              super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
              )._M_impl.super__Vector_impl_data._M_finish -
       (long)(geometry->
             super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
             )._M_impl.super__Vector_impl_data._M_start) / 0xc;
  interf_cov_vector.super_Matrix<std::complex<float>_>._vptr_Matrix =
       (_func_int **)(mat->super_Matrix<std::complex<float>_>).num_rows_;
  psVar3 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                     ((unsigned_long *)&local_1a8,(unsigned_long *)&interf_cov_vector,
                      "geometry.size() == mat->num_rows()");
  if (psVar3 == (string *)0x0) {
    local_1a8._0_8_ =
         ((long)(geometry->
                super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                )._M_impl.super__Vector_impl_data._M_finish -
         (long)(geometry->
               super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
               )._M_impl.super__Vector_impl_data._M_start) / 0xc;
    interf_cov_vector.super_Matrix<std::complex<float>_>._vptr_Matrix =
         (_func_int **)(mat->super_Matrix<std::complex<float>_>).num_columns_;
    psVar3 = rtc::CheckEQImpl<unsigned_long,unsigned_long>
                       ((unsigned_long *)&local_1a8,(unsigned_long *)&interf_cov_vector,
                        "geometry.size() == mat->num_columns()");
    if (psVar3 == (string *)0x0) {
      ComplexMatrix<float>::ComplexMatrix
                (&interf_cov_vector,1,
                 ((long)(geometry->
                        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(geometry->
                       super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0xc);
      ComplexMatrix<float>::ComplexMatrix
                (&interf_cov_vector_transposed,
                 ((long)(geometry->
                        super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                        )._M_impl.super__Vector_impl_data._M_finish -
                 (long)(geometry->
                       super__Vector_base<webrtc::CartesianPoint<float>,_std::allocator<webrtc::CartesianPoint<float>_>_>
                       )._M_impl.super__Vector_impl_data._M_start) / 0xc,1);
      PhaseAlignmentMasks(frequency_bin,fft_size,sample_rate,sound_speed,geometry,angle,
                          &interf_cov_vector);
      local_29c = 1;
      local_1a8._0_8_ = interf_cov_vector.super_Matrix<std::complex<float>_>.num_rows_;
      psVar3 = rtc::CheckEQImpl<unsigned_int,unsigned_long>
                         (&local_29c,(unsigned_long *)&local_1a8,"1u == x.num_rows()");
      if (psVar3 == (string *)0x0) {
        fVar5 = 0.0;
        for (sVar4 = 0; interf_cov_vector.super_Matrix<std::complex<float>_>.num_columns_ != sVar4;
            sVar4 = sVar4 + 1) {
          fVar1 = *(float *)&(*interf_cov_vector.super_Matrix<std::complex<float>_>.elements_.
                               super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                               ._M_impl.super__Vector_impl_data._M_start)[sVar4]._M_value;
          fVar2 = *(float *)((long)&(*interf_cov_vector.super_Matrix<std::complex<float>_>.elements_
                                      .
                                      super__Vector_base<std::complex<float>_*,_std::allocator<std::complex<float>_*>_>
                                      ._M_impl.super__Vector_impl_data._M_start)[sVar4]._M_value + 4
                            );
          fVar5 = fVar5 + fVar1 * fVar1 + fVar2 * fVar2;
        }
        if (fVar5 < 0.0) {
          fVar5 = sqrtf(fVar5);
        }
        else {
          fVar5 = SQRT(fVar5);
        }
        local_2a0 = 1.0 / fVar5;
        Matrix<std::complex<float>_>::Scale<float>
                  (&interf_cov_vector.super_Matrix<std::complex<float>_>,&local_2a0);
        Matrix<std::complex<float>_>::Transpose
                  (&interf_cov_vector_transposed.super_Matrix<std::complex<float>_>,
                   &interf_cov_vector.super_Matrix<std::complex<float>_>);
        ComplexMatrix<float>::PointwiseConjugate(&interf_cov_vector);
        Matrix<std::complex<float>_>::Multiply
                  (&mat->super_Matrix<std::complex<float>_>,
                   &interf_cov_vector_transposed.super_Matrix<std::complex<float>_>,
                   &interf_cov_vector.super_Matrix<std::complex<float>_>);
        Matrix<std::complex<float>_>::~Matrix
                  (&interf_cov_vector_transposed.super_Matrix<std::complex<float>_>);
        Matrix<std::complex<float>_>::~Matrix(&interf_cov_vector.super_Matrix<std::complex<float>_>)
        ;
        return;
      }
      rtc::FatalMessage::FatalMessage
                (&local_1a8,
                 "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
                 ,0x1e,psVar3);
      rtc::FatalMessage::~FatalMessage(&local_1a8);
    }
    line = 0x48;
  }
  else {
    line = 0x47;
  }
  rtc::FatalMessage::FatalMessage
            (&local_1a8,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/beamformer/covariance_matrix_generator.cc"
             ,line,psVar3);
  rtc::FatalMessage::~FatalMessage(&local_1a8);
}

Assistant:

void CovarianceMatrixGenerator::AngledCovarianceMatrix(
    float sound_speed,
    float angle,
    size_t frequency_bin,
    size_t fft_size,
    size_t num_freq_bins,
    int sample_rate,
    const std::vector<Point>& geometry,
    ComplexMatrix<float>* mat) {
  RTC_CHECK_EQ(geometry.size(), mat->num_rows());
  RTC_CHECK_EQ(geometry.size(), mat->num_columns());

  ComplexMatrix<float> interf_cov_vector(1, geometry.size());
  ComplexMatrix<float> interf_cov_vector_transposed(geometry.size(), 1);
  PhaseAlignmentMasks(frequency_bin,
                      fft_size,
                      sample_rate,
                      sound_speed,
                      geometry,
                      angle,
                      &interf_cov_vector);
  interf_cov_vector.Scale(1.f / Norm(interf_cov_vector));
  interf_cov_vector_transposed.Transpose(interf_cov_vector);
  interf_cov_vector.PointwiseConjugate();
  mat->Multiply(interf_cov_vector_transposed, interf_cov_vector);
}